

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_thread.c
# Opt level: O1

QcThreadKey * qc_thread_key_create(void)

{
  int iVar1;
  QcThreadKey *pQVar2;
  pthread_mutex_t *ppVar3;
  void *in_RSI;
  pthread_key_t *__ptr;
  pthread_mutex_t *ppVar4;
  
  __ptr = (pthread_key_t *)0x4;
  pQVar2 = (QcThreadKey *)malloc(4);
  if (pQVar2 != (QcThreadKey *)0x0) {
    pQVar2->key_t = 0;
    iVar1 = pthread_key_create((pthread_key_t *)pQVar2,(__destr_function *)0x0);
    if (iVar1 != 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x8e,"threadkey create failed");
      free(pQVar2);
      pQVar2 = (QcThreadKey *)0x0;
    }
    return pQVar2;
  }
  qc_thread_key_create_cold_1();
  if (__ptr != (pthread_key_t *)0x0) {
    iVar1 = pthread_key_delete(*__ptr);
    if (iVar1 == 0) {
      free(__ptr);
      pQVar2 = (QcThreadKey *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x9d,"threadkey delete failed");
      pQVar2 = (QcThreadKey *)0xffffffff;
    }
    return pQVar2;
  }
  qc_thread_key_delete_cold_1();
  if (__ptr != (pthread_key_t *)0x0) {
    iVar1 = pthread_setspecific(*__ptr,in_RSI);
    if (iVar1 == 0) {
      pQVar2 = (QcThreadKey *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0xac,"thread_key setspecific failed");
      pQVar2 = (QcThreadKey *)0xffffffff;
    }
    return pQVar2;
  }
  qc_thread_setspecific_cold_1();
  if (__ptr != (pthread_key_t *)0x0) {
    pQVar2 = (QcThreadKey *)pthread_getspecific(*__ptr);
    return pQVar2;
  }
  qc_thread_getspecific_cold_1();
  ppVar4 = (pthread_mutex_t *)0x28;
  ppVar3 = (pthread_mutex_t *)malloc(0x28);
  if (ppVar3 != (pthread_mutex_t *)0x0) {
    *(int *)((long)ppVar3 + 0x10) = 0;
    *(int *)((long)ppVar3 + 0x14) = 0;
    (ppVar3->__data).__list.__prev = (__pthread_internal_list *)0x0;
    ppVar3->__align = 0;
    *(int *)((long)ppVar3 + 8) = 0;
    *(uint *)((long)ppVar3 + 0xc) = 0;
    (ppVar3->__data).__list.__next = (__pthread_internal_list *)0x0;
    iVar1 = pthread_mutex_init(ppVar3,(pthread_mutexattr_t *)0x0);
    if (iVar1 != 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0xc9,"thread mutex create failed");
      free(ppVar3);
      ppVar3 = (pthread_mutex_t *)0x0;
    }
    return (QcThreadKey *)ppVar3;
  }
  qc_thread_mutex_create_cold_1();
  if (ppVar4 != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_destroy(ppVar4);
    if (iVar1 == 0) {
      free(ppVar4);
      pQVar2 = (QcThreadKey *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0xd8,"thread mutex destroy failed");
      pQVar2 = (QcThreadKey *)0xffffffff;
    }
    return pQVar2;
  }
  qc_thread_mutex_destroy_cold_1();
  if (ppVar4 != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_lock(ppVar4);
    if (iVar1 == 0) {
      pQVar2 = (QcThreadKey *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0xe7,"thread mutex lock failed");
      pQVar2 = (QcThreadKey *)0xffffffff;
    }
    return pQVar2;
  }
  qc_thread_mutex_lock_cold_1();
  if (ppVar4 != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_unlock(ppVar4);
    if (iVar1 == 0) {
      pQVar2 = (QcThreadKey *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0xf5,"thread mutex unlock failed");
      pQVar2 = (QcThreadKey *)0xffffffff;
    }
    return pQVar2;
  }
  qc_thread_mutex_unlock_cold_1();
  ppVar4 = (pthread_mutex_t *)0x28;
  ppVar3 = (pthread_mutex_t *)malloc(0x28);
  if (ppVar3 != (pthread_mutex_t *)0x0) {
    *(int *)((long)ppVar3 + 0x10) = 0;
    *(int *)((long)ppVar3 + 0x14) = 0;
    (ppVar3->__data).__list.__prev = (__pthread_internal_list *)0x0;
    ppVar3->__align = 0;
    *(int *)((long)ppVar3 + 8) = 0;
    *(uint *)((long)ppVar3 + 0xc) = 0;
    (ppVar3->__data).__list.__next = (__pthread_internal_list *)0x0;
    iVar1 = pthread_mutex_init(ppVar3,(pthread_mutexattr_t *)0x0);
    if (iVar1 != 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x10a,"thread condlock create failed");
      free(ppVar3);
      ppVar3 = (pthread_mutex_t *)0x0;
    }
    return (QcThreadKey *)ppVar3;
  }
  qc_thread_condlock_create_cold_1();
  iVar1 = pthread_mutex_destroy(ppVar4);
  if (iVar1 == 0) {
    free(ppVar4);
    pQVar2 = (QcThreadKey *)0x0;
  }
  else {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
              ,0x117,"thread condlock destroy failed");
    pQVar2 = (QcThreadKey *)0xffffffff;
  }
  return pQVar2;
}

Assistant:

QcThreadKey* qc_thread_key_create()
{
    QcThreadKey *threadkey;

    qc_malloc(threadkey, sizeof(QcThreadKey));
    if(NULL == threadkey)
    {
        return NULL;
    }

    if(0 != pthread_key_create(&threadkey->key_t, NULL))
    {
        qc_error("threadkey create failed");
        qc_free(threadkey);
        return NULL;
    }

    return threadkey;
}